

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O1

void drawVertex(btIDebugDraw *idraw,btVector3 *x,btScalar s,btVector3 *c)

{
  undefined8 uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  float fVar2;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  fVar2 = (float)*(undefined8 *)x->m_floats;
  local_38._4_4_ = (undefined4)((ulong)*(undefined8 *)x->m_floats >> 0x20);
  local_38._0_4_ = fVar2 - s;
  local_38._8_4_ = x->m_floats[2];
  local_38._12_4_ = 0;
  local_48._4_4_ = (float)local_38._4_4_ + 0.0;
  local_48._0_4_ = s + fVar2;
  local_48._8_4_ = x->m_floats[2] + 0.0;
  local_48._12_4_ = 0;
  (*idraw->_vptr_btIDebugDraw[4])(idraw,local_38,local_48,c,in_R8,in_R9,s);
  local_38._0_4_ = (undefined4)*(undefined8 *)x->m_floats;
  fVar2 = (float)((ulong)*(undefined8 *)x->m_floats >> 0x20);
  local_38._4_4_ = fVar2 - s;
  local_38._8_4_ = x->m_floats[2];
  local_38._12_4_ = 0;
  local_48._4_4_ = s + fVar2;
  local_48._0_4_ = (float)local_38._0_4_ + 0.0;
  local_48._8_4_ = x->m_floats[2] + 0.0;
  local_48._12_4_ = 0;
  (*idraw->_vptr_btIDebugDraw[4])(idraw,local_38,local_48,c);
  uVar1 = *(undefined8 *)x->m_floats;
  local_38._8_4_ = x->m_floats[2] - s;
  local_38._0_8_ = uVar1;
  local_38._12_4_ = 0;
  local_48._4_4_ = (float)((ulong)uVar1 >> 0x20) + 0.0;
  local_48._0_4_ = (float)uVar1 + 0.0;
  local_48._8_4_ = x->m_floats[2] + s;
  local_48._12_4_ = 0;
  (*idraw->_vptr_btIDebugDraw[4])(idraw,local_38,local_48,c);
  return;
}

Assistant:

static void				drawVertex(	btIDebugDraw* idraw,
								   const btVector3& x,btScalar s,const btVector3& c)
{
	idraw->drawLine(x-btVector3(s,0,0),x+btVector3(s,0,0),c);
	idraw->drawLine(x-btVector3(0,s,0),x+btVector3(0,s,0),c);
	idraw->drawLine(x-btVector3(0,0,s),x+btVector3(0,0,s),c);
}